

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_scalar.c
# Opt level: O2

t_scalar * scalar_new(_glist *owner,t_symbol *templatesym)

{
  int iVar1;
  t_template *template;
  t_scalar *x;
  t_gpointer gp;
  anon_union_8_2_4cf7151e_for_gp_un local_38;
  undefined4 local_30;
  undefined8 local_28;
  
  local_28 = 0;
  local_30 = 0;
  local_38.gp_scalar = (_scalar *)0x0;
  template = template_findbyname(templatesym);
  if (template == (t_template *)0x0) {
    x = (t_scalar *)0x0;
    pd_error((void *)0x0,"scalar: couldn\'t find template %s",templatesym->s_name);
  }
  else {
    iVar1 = template_cancreate(template);
    if (iVar1 == 0) {
      x = (t_scalar *)0x0;
    }
    else {
      x = (t_scalar *)getbytes((long)template->t_n * 8 + 0x18);
      (x->sc_gobj).g_pd = scalar_class;
      x->sc_template = templatesym;
      gpointer_setglist((t_gpointer *)&local_38,owner,x);
      word_init(x->sc_vec,template,(t_gpointer *)&local_38);
    }
  }
  return x;
}

Assistant:

t_scalar *scalar_new(t_glist *owner, t_symbol *templatesym)
{
    t_scalar *x;
    t_template *template;
    t_gpointer gp;
    gpointer_init(&gp);
    template = template_findbyname(templatesym);
    if (!template)
    {
        pd_error(0, "scalar: couldn't find template %s", templatesym->s_name);
        return (0);
    }
    if (!template_cancreate(template))
        return (0);
    x = (t_scalar *)getbytes(sizeof(t_scalar) +
        (template->t_n - 1) * sizeof(*x->sc_vec));
    x->sc_gobj.g_pd = scalar_class;
    x->sc_template = templatesym;
    gpointer_setglist(&gp, owner, x);
    word_init(x->sc_vec, template, &gp);
    return (x);
}